

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

void __thiscall
helics::HandleManager::addHandleAtIndex
          (HandleManager *this,BasicHandleInfo *otherHandle,int32_t index)

{
  bool bVar1;
  size_type sVar2;
  int in_EDX;
  HandleManager *in_RSI;
  deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *in_RDI;
  BasicHandleInfo *in_stack_00000008;
  undefined4 in_stack_00000010;
  int32_t in_stack_00000414;
  BasicHandleInfo *in_stack_00000418;
  HandleManager *in_stack_00000420;
  deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
  *in_stack_ffffffffffffffd8;
  int iVar3;
  
  iVar3 = in_EDX;
  sVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::size
                    ((deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)
                     0x63ffe9);
  if (in_EDX == (int)sVar2) {
    addHandle(in_RSI,(BasicHandleInfo *)CONCAT44(iVar3,in_EDX));
  }
  else {
    bVar1 = isValidIndex<int,std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>>
                      ((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffd8);
    if (bVar1) {
      std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::operator[]
                (in_RDI,(size_type)in_stack_ffffffffffffffd8);
      BasicHandleInfo::BasicHandleInfo
                ((BasicHandleInfo *)CONCAT44(index,in_stack_00000010),in_stack_00000008);
      std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::operator[]
                (in_RDI,(size_type)in_stack_ffffffffffffffd8);
      addSearchFields(in_stack_00000420,in_stack_00000418,in_stack_00000414);
    }
    else if (0 < iVar3) {
      std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::resize
                ((deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)
                 CONCAT44(index,in_stack_00000010),(size_type)in_stack_00000008);
      std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::operator[]
                (in_RDI,(size_type)in_stack_ffffffffffffffd8);
      BasicHandleInfo::BasicHandleInfo
                ((BasicHandleInfo *)CONCAT44(index,in_stack_00000010),in_stack_00000008);
      std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::operator[]
                (in_RDI,(size_type)in_stack_ffffffffffffffd8);
      addSearchFields(in_stack_00000420,in_stack_00000418,in_stack_00000414);
    }
  }
  return;
}

Assistant:

void HandleManager::addHandleAtIndex(const BasicHandleInfo& otherHandle, int32_t index)
{
    if (index == static_cast<int32_t>(handles.size())) {
        addHandle(otherHandle);
    } else if (isValidIndex(index, handles)) {
        // use placement new to reconstruct new object
        new (&handles[index]) BasicHandleInfo(otherHandle);
        addSearchFields(handles[index], index);
    } else if (index > 0) {
        handles.resize(static_cast<size_t>(index) + 1);
        // use placement new to reconstruct new object
        new (&handles[index]) BasicHandleInfo(otherHandle);
        addSearchFields(handles[index], index);
    }
}